

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

result_type
time_plain<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
          (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           *r)

{
  long lVar1;
  result_type rVar2;
  result_type rVar3;
  long lVar4;
  string res;
  string local_48;
  double local_28;
  
  lVar4 = 0x1000000;
  rVar3 = 0;
  lVar1 = std::chrono::_V2::system_clock::now();
  do {
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(r);
    rVar3 = rVar3 + rVar2;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  lVar4 = std::chrono::_V2::system_clock::now();
  local_28 = 16.777216 / ((double)((lVar4 - lVar1) / 1000) * 1e-06);
  to_string<double>(&local_48,&local_28);
  while (local_48._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_48);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_48._M_dataplus._M_p,local_48._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return rVar3;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}